

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_cost_test.cc
# Opt level: O1

void anon_unknown.dwarf_24a7d2c::TestMvComponentCostTable(MvSubpelPrecision precision)

{
  undefined8 *puVar1;
  void *pvVar2;
  void *pvVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  int *mvcost;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  AssertHelper *pAVar11;
  SEARCH_METHODS *pSVar12;
  uint uVar13;
  long lVar14;
  int *lhs;
  aom_cdf_prob *paVar15;
  ulong uVar16;
  int *lhs_00;
  int sign_cost [2];
  int class_cost [11];
  int class0_fp_cost [2] [4];
  int hp_cost [2];
  int class0_hp_cost [2];
  int class0_cost [2];
  int bits_cost [10] [2];
  int fp_cost [4];
  int local_110;
  int local_10c;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108 [6];
  AssertHelper local_d8 [5];
  int local_b0 [2];
  int local_a8 [2];
  int local_a0 [2];
  internal local_98 [8];
  undefined8 *local_90;
  AssertHelper local_48 [3];
  
  pvVar2 = operator_new__(0x1fffc);
  pvVar3 = operator_new__(0x1fffc);
  av1_cost_tokens_from_cdf
            (&local_110,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x36),
             (int *)0x0);
  av1_cost_tokens_from_cdf
            ((int *)local_108,(aom_cdf_prob *)(anonymous_namespace)::kTestComponentContext,
             (int *)0x0);
  av1_cost_tokens_from_cdf
            (local_a0,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x48),
             (int *)0x0);
  lhs = (int *)((long)pvVar2 + 0xfffc);
  mvcost = (int *)((long)pvVar3 + 0xfffc);
  paVar15 = (aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x4e);
  lVar14 = 0;
  do {
    av1_cost_tokens_from_cdf((int *)(local_98 + lVar14),paVar15,(int *)0x0);
    lVar14 = lVar14 + 8;
    paVar15 = paVar15 + 3;
  } while (lVar14 != 0x50);
  paVar15 = (aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x18);
  lVar14 = 0;
  do {
    av1_cost_tokens_from_cdf((int *)((long)&local_d8[0].data_ + lVar14),paVar15,(int *)0x0);
    lVar14 = lVar14 + 0x10;
    paVar15 = paVar15 + 5;
  } while (lVar14 == 0x10);
  av1_cost_tokens_from_cdf
            ((int *)local_48,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x2c),
             (int *)0x0);
  if ('\0' < precision) {
    av1_cost_tokens_from_cdf
              (local_a8,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x3c),
               (int *)0x0);
    av1_cost_tokens_from_cdf
              (local_b0,(aom_cdf_prob *)((anonymous_namespace)::kTestComponentContext + 0x42),
               (int *)0x0);
  }
  *lhs = 0;
  uVar8 = 1;
  do {
    uVar13 = (uint)(uVar8 - 1);
    uVar5 = 0x1f;
    if ((int)uVar13 >> 3 != 0) {
      for (; (uint)((int)uVar13 >> 3) >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    if (uVar8 < 9) {
      uVar5 = 0;
    }
    bVar4 = (byte)uVar5;
    iVar9 = -8 << (bVar4 & 0x1f);
    if (bVar4 == 0) {
      iVar9 = 0;
    }
    uVar10 = (int)(iVar9 + uVar13) >> 3;
    uVar16 = (ulong)(uVar5 & 0xff);
    iVar9 = *(int *)((long)&local_108[0]._M_head_impl + uVar16 * 4);
    if (bVar4 == 0) {
      iVar9 = iVar9 + local_a0[(int)uVar10];
    }
    else {
      uVar6 = 0;
      do {
        iVar9 = iVar9 + *(int *)(local_98 +
                                uVar6 * 8 + (ulong)((uVar10 >> ((uint)uVar6 & 0x1f) & 1) != 0) * 4);
        uVar6 = uVar6 + 1;
      } while (uVar16 != uVar6);
    }
    if (-1 < precision) {
      pAVar11 = local_d8 + (long)(int)uVar10 * 2;
      if (uVar16 != 0) {
        pAVar11 = local_48;
      }
      iVar9 = iVar9 + *(int *)((long)&pAVar11->data_ + (ulong)((uint)(uVar8 - 1 >> 1) & 3) * 4);
      if ('\0' < precision) {
        piVar7 = local_b0;
        if (uVar16 == 0) {
          piVar7 = local_a8;
        }
        iVar9 = iVar9 + piVar7[uVar13 & 1];
      }
    }
    lhs[uVar8] = iVar9 + local_110;
    lhs[-uVar8] = iVar9 + local_10c;
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x4000);
  av1_build_nmv_component_cost_table
            (mvcost,(nmv_component *)(anonymous_namespace)::kTestComponentContext,precision);
  lVar14 = 0;
  piVar7 = mvcost;
  lhs_00 = lhs;
  do {
    testing::internal::CmpHelperEQ<int,int>(local_98,"mvcost_ref[v]","mvcost[v]",lhs,mvcost);
    puVar1 = local_90;
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_108[0]._M_head_impl + 0x10),"v = ",4);
      std::ostream::operator<<(local_108[0]._M_head_impl + 0x10,(int)lVar14);
      if (local_90 == (undefined8 *)0x0) {
        pSVar12 = "";
      }
      else {
        pSVar12 = (SEARCH_METHODS *)*local_90;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/mv_cost_test.cc"
                 ,0x6c,(char *)pSVar12);
      testing::internal::AssertHelper::operator=(local_d8,(Message *)local_108);
LAB_00793f5c:
      testing::internal::AssertHelper::~AssertHelper(local_d8);
      if (local_108[0]._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108[0]._M_head_impl + 8))();
      }
      if (local_90 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_90 != local_90 + 2) {
          operator_delete((undefined8 *)*local_90);
        }
        operator_delete(local_90);
      }
      break;
    }
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<int,int>(local_98,"mvcost_ref[-v]","mvcost[-v]",lhs_00,piVar7);
    puVar1 = local_90;
    if (local_98[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_108);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_108[0]._M_head_impl + 0x10),"v = ",4);
      std::ostream::operator<<(local_108[0]._M_head_impl + 0x10,(int)lVar14);
      if (local_90 == (undefined8 *)0x0) {
        pSVar12 = "";
      }
      else {
        pSVar12 = (SEARCH_METHODS *)*local_90;
      }
      testing::internal::AssertHelper::AssertHelper
                (local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/mv_cost_test.cc"
                 ,0x6d,(char *)pSVar12);
      testing::internal::AssertHelper::operator=(local_d8,(Message *)local_108);
      goto LAB_00793f5c;
    }
    if (local_90 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_90 != local_90 + 2) {
        operator_delete((undefined8 *)*local_90);
      }
      operator_delete(puVar1);
    }
    lVar14 = lVar14 + 1;
    lhs_00 = lhs_00 + -1;
    piVar7 = piVar7 + -1;
    mvcost = mvcost + 1;
    lhs = lhs + 1;
  } while (lVar14 != 0x4000);
  operator_delete__(pvVar3);
  operator_delete__(pvVar2);
  return;
}

Assistant:

void TestMvComponentCostTable(MvSubpelPrecision precision) {
  std::unique_ptr<int[]> mvcost_ref_buf(new int[MV_VALS]);
  std::unique_ptr<int[]> mvcost_buf(new int[MV_VALS]);
  int *mvcost_ref = mvcost_ref_buf.get() + MV_MAX;
  int *mvcost = mvcost_buf.get() + MV_MAX;

  ReferenceBuildNmvComponentCostTable(mvcost_ref, &kTestComponentContext,
                                      precision);
  av1_build_nmv_component_cost_table(mvcost, &kTestComponentContext, precision);

  for (int v = 0; v <= MV_MAX; ++v) {
    ASSERT_EQ(mvcost_ref[v], mvcost[v]) << "v = " << v;
    ASSERT_EQ(mvcost_ref[-v], mvcost[-v]) << "v = " << v;
  }
}